

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_short,10u>,Counter<unsigned_char,8u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  uint original;
  uint uVar6;
  uint recent;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  
  iVar4 = 0;
  for (uVar6 = 0; uVar6 != 0x200; uVar6 = uVar6 + 1) {
    uVar3 = (ushort)uVar6;
    uVar1 = uVar3 & 0xff;
    uVar8 = uVar6;
    for (uVar7 = 0; uVar7 != 0x200; uVar7 = uVar7 + 1) {
      if (uVar7 < uVar6) {
        if ((int)uVar8 < 0x80 - bias) {
LAB_00101d5b:
          uVar2 = (ushort)uVar7;
          uVar5 = uVar2 & 0x100 | uVar1;
          uVar9 = uVar2 & 0xff;
          if (uVar9 < uVar1) {
            if ((ushort)(0x80 - bias) <= (ushort)(uVar1 - uVar9)) {
              uVar5 = uVar5 + 0x300 & 0x3ff;
            }
          }
          else if ((ushort)(bias + 0x80) < (ushort)(uVar9 - uVar1)) {
            uVar5 = uVar5 + 0x100;
          }
          if ((uVar5 != uVar3) || ((bias == 0 && (((short)(char)uVar8 + uVar2 & 0x3ff) != uVar3))))
          goto LAB_00101dde;
        }
      }
      else if ((int)(iVar4 + uVar7) <= bias + 0x80) goto LAB_00101d5b;
      uVar8 = uVar8 - 1;
    }
    iVar4 = iVar4 + -1;
  }
LAB_00101dde:
  return 0x1ff < uVar6;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}